

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall
SimpleString::split(SimpleString *this,SimpleString *delimiter,SimpleStringCollection *col)

{
  bool bVar1;
  SimpleStringCollection *this_00;
  ulong _size;
  SimpleString *other;
  SimpleString *in_RSI;
  SimpleString *in_RDI;
  size_t i;
  char *prev;
  char *str;
  size_t extraEndToken;
  size_t num;
  SimpleString *in_stack_ffffffffffffff58;
  SimpleString *in_stack_ffffffffffffff60;
  SimpleString *in_stack_ffffffffffffff70;
  SimpleString *in_stack_ffffffffffffff80;
  SimpleStringCollection *in_stack_ffffffffffffff88;
  SimpleStringCollection *local_40;
  char *local_30;
  
  this_00 = (SimpleStringCollection *)count(in_stack_ffffffffffffff80,in_RDI);
  bVar1 = endsWith(in_RDI,in_stack_ffffffffffffff70);
  _size = (ulong)!bVar1;
  SimpleStringCollection::allocate(this_00,_size);
  local_30 = getBuffer(in_RDI);
  for (local_40 = (SimpleStringCollection *)0x0; local_40 < this_00;
      local_40 = (SimpleStringCollection *)((long)&local_40->collection_ + 1)) {
    getBuffer(in_RSI);
    local_30 = StrStr(local_30,(char *)in_stack_ffffffffffffff60);
    local_30 = local_30 + 1;
    SimpleString(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    subString((SimpleString *)in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80,
              (size_t)in_RDI);
    in_stack_ffffffffffffff60 =
         SimpleStringCollection::operator[]
                   (in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
    operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ~SimpleString((SimpleString *)0x111104);
    ~SimpleString((SimpleString *)0x11110e);
  }
  if (_size != 0) {
    SimpleString(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    other = SimpleStringCollection::operator[]
                      (in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
    operator=(in_stack_ffffffffffffff60,other);
    ~SimpleString((SimpleString *)0x1111a4);
  }
  return;
}

Assistant:

void SimpleString::split(const SimpleString& delimiter, SimpleStringCollection& col) const
{
    size_t num = count(delimiter);
    size_t extraEndToken = (endsWith(delimiter)) ? 0 : 1U;
    col.allocate(num + extraEndToken);

    const char* str = getBuffer();
    const char* prev;
    for (size_t i = 0; i < num; ++i) {
        prev = str;
        str = StrStr(str, delimiter.getBuffer()) + 1;
        col[i] = SimpleString(prev).subString(0, size_t (str - prev));
    }
    if (extraEndToken) {
        col[num] = str;
    }
}